

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

Matrix33d * gmath::createRz(Matrix33d *__return_storage_ptr__,double a)

{
  double dVar1;
  
  dVar1 = cos(a);
  __return_storage_ptr__->v[0][0] = dVar1;
  dVar1 = sin(a);
  __return_storage_ptr__->v[0][1] = -dVar1;
  __return_storage_ptr__->v[0][2] = 0.0;
  dVar1 = sin(a);
  __return_storage_ptr__->v[1][0] = dVar1;
  dVar1 = cos(a);
  __return_storage_ptr__->v[1][1] = dVar1;
  __return_storage_ptr__->v[1][2] = 0.0;
  __return_storage_ptr__->v[2][0] = 0.0;
  __return_storage_ptr__->v[2][1] = 0.0;
  __return_storage_ptr__->v[2][2] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createRz(double a)
{
  Matrix33d ret;

  ret(0, 0)=cos(a);
  ret(0, 1)=-sin(a);
  ret(0, 2)=0.0;

  ret(1, 0)=sin(a);
  ret(1, 1)=cos(a);
  ret(1, 2)=0.0;

  ret(2, 0)=0.0;
  ret(2, 1)=0.0;
  ret(2, 2)=1.0;

  return ret;
}